

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCodeGeneratedColumn(Parse *pParse,Table *pTab,Column *pCol,int regOut)

{
  int p4type;
  Column *in_RDX;
  Table *in_RSI;
  Expr *in_RDI;
  int nErr;
  Vdbe *v;
  int iAddr;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  Expr *pExpr;
  int in_stack_ffffffffffffffd0;
  int op;
  
  op = (in_RDI->w).iJoin;
  if ((in_RDI->y).sub.regReturn < 1) {
    p4type = 0;
  }
  else {
    p4type = sqlite3VdbeAddOp3((Vdbe *)in_RDI->pLeft,op,in_stack_ffffffffffffffd0,
                               (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                               (int)in_stack_ffffffffffffffc8);
  }
  pExpr = in_RDI;
  sqlite3ColumnExpr(in_RSI,in_RDX);
  sqlite3ExprCodeCopy((Parse *)CONCAT44(op,in_stack_ffffffffffffffd0),pExpr,
                      in_stack_ffffffffffffffc4);
  if ('A' < in_RDX->affinity) {
    sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,in_stack_ffffffffffffffd0),(int)((ulong)pExpr >> 0x20),
                      (int)pExpr,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                      (char *)CONCAT44(in_stack_ffffffffffffffbc,1),p4type);
  }
  if (p4type != 0) {
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
  }
  if (op < (in_RDI->w).iJoin) {
    *(undefined4 *)(*(long *)in_RDI + 0x54) = 0xffffffff;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGeneratedColumn(
  Parse *pParse,     /* Parsing context */
  Table *pTab,       /* Table containing the generated column */
  Column *pCol,      /* The generated column */
  int regOut         /* Put the result in this register */
){
  int iAddr;
  Vdbe *v = pParse->pVdbe;
  int nErr = pParse->nErr;
  assert( v!=0 );
  assert( pParse->iSelfTab!=0 );
  if( pParse->iSelfTab>0 ){
    iAddr = sqlite3VdbeAddOp3(v, OP_IfNullRow, pParse->iSelfTab-1, 0, regOut);
  }else{
    iAddr = 0;
  }
  sqlite3ExprCodeCopy(pParse, sqlite3ColumnExpr(pTab,pCol), regOut);
  if( pCol->affinity>=SQLITE_AFF_TEXT ){
    sqlite3VdbeAddOp4(v, OP_Affinity, regOut, 1, 0, &pCol->affinity, 1);
  }
  if( iAddr ) sqlite3VdbeJumpHere(v, iAddr);
  if( pParse->nErr>nErr ) pParse->db->errByteOffset = -1;
}